

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextedit.cpp
# Opt level: O3

void __thiscall QTextEdit::append(QTextEdit *this,QString *text)

{
  long lVar1;
  QAbstractSlider *this_00;
  char cVar2;
  TextInteractionFlags TVar3;
  int iVar4;
  int iVar5;
  QTextEditPrivate *d;
  long in_FS_OFFSET;
  QWidgetTextControl local_30 [8];
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = *(long *)&(this->super_QAbstractScrollArea).super_QFrame.super_QWidget.field_0x8;
  if ((*(QWidgetTextControl **)(lVar1 + 0x2f8) == (QWidgetTextControl *)0x0) ||
     (TVar3 = QWidgetTextControl::textInteractionFlags(*(QWidgetTextControl **)(lVar1 + 0x2f8)),
     ((uint)TVar3.super_QFlagsStorageHelper<Qt::TextInteractionFlag,_4>.
            super_QFlagsStorage<Qt::TextInteractionFlag>.i & 0x10) == 0)) {
    iVar4 = QAbstractSlider::value(*(QAbstractSlider **)(lVar1 + 0x290));
    iVar5 = QAbstractSlider::maximum(*(QAbstractSlider **)(lVar1 + 0x290));
    QWidgetTextControl::append(*(QWidgetTextControl **)(lVar1 + 0x2f8),text);
    if (iVar4 < iVar5) goto LAB_004a36da;
  }
  else {
    QWidgetTextControl::textCursor(local_30);
    cVar2 = QTextCursor::atEnd();
    QTextCursor::~QTextCursor((QTextCursor *)local_30);
    QWidgetTextControl::append(*(QWidgetTextControl **)(lVar1 + 0x2f8),text);
    if (cVar2 == '\0') goto LAB_004a36da;
  }
  this_00 = *(QAbstractSlider **)(lVar1 + 0x290);
  iVar4 = QAbstractSlider::maximum(this_00);
  QAbstractSlider::setValue(this_00,iVar4);
LAB_004a36da:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_28) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QTextEdit::append(const QString &text)
{
    Q_D(QTextEdit);
    const bool atBottom = isReadOnly() ?  d->verticalOffset() >= d->vbar->maximum() :
            d->control->textCursor().atEnd();
    d->control->append(text);
    if (atBottom)
        d->vbar->setValue(d->vbar->maximum());
}